

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_service_helpers(t_c_glib_generator *this,t_service *tservice)

{
  t_program *program;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  string *psVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  t_type *ptVar7;
  t_struct *this_00;
  reference pptVar8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_368
  ;
  t_field **local_360;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_358
  ;
  const_iterator field_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *xs;
  string local_338;
  undefined1 local_318 [8];
  t_field success;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  t_struct result;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [8];
  string arg_list_name_orig;
  t_struct *arg_list;
  string local_68 [8];
  string function_name;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_38;
  iterator function_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_c_glib_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_38);
  local_38._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  while( true ) {
    function_name.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
    bVar2 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&function_name.field_2 + 8));
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    psVar6 = t_function::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string(local_68,(string *)psVar6);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    arg_list_name_orig.field_2._8_8_ = t_function::get_arglist(*pptVar5);
    iVar3 = (*(((t_struct *)arg_list_name_orig.field_2._8_8_)->super_t_type).super_t_doc._vptr_t_doc
              [3])();
    std::__cxx11::string::string(local_a0,(string *)CONCAT44(extraout_var,iVar3));
    uVar1 = arg_list_name_orig.field_2._8_8_;
    iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)&result.xsd_all_,local_68);
    underscores_to_initial_caps(&local_100,(string *)&result.xsd_all_);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar3),&local_100);
    std::operator+(&local_c0,&local_e0,"Args");
    (**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&result.xsd_all_);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x15])
              (this,arg_list_name_orig.field_2._8_8_);
    (**(code **)(*(long *)arg_list_name_orig.field_2._8_8_ + 0x10))
              (arg_list_name_orig.field_2._8_8_,local_a0);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    bVar2 = t_function::is_oneway(*pptVar5);
    if (!bVar2) {
      program = (this->super_t_oop_generator).super_t_generator.program_;
      iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&success.reference_,local_68);
      underscores_to_initial_caps(&local_248,(string *)&success.reference_);
      std::operator+(&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_01,iVar3),&local_248);
      std::operator+(&local_208,&local_228,"Result");
      t_struct::t_struct((t_struct *)local_1e8,program,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&success.reference_);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_38);
      ptVar7 = t_function::get_returntype(*pptVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_338,"success",(allocator *)((long)&xs + 7));
      t_field::t_field((t_field *)local_318,ptVar7,&local_338,0);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
      t_field::set_req((t_field *)local_318,T_OPTIONAL);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_38);
      ptVar7 = t_function::get_returntype(*pptVar5);
      uVar4 = (*(ptVar7->super_t_doc)._vptr_t_doc[4])();
      if ((uVar4 & 1) == 0) {
        t_struct::append((t_struct *)local_1e8,(t_field *)local_318);
      }
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_38);
      this_00 = t_function::get_xceptions(*pptVar5);
      field_iter._M_current = (t_field **)t_struct::get_members(this_00);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_358);
      local_360 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(field_iter._M_current);
      local_358._M_current = local_360;
      while( true ) {
        local_368._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end(field_iter._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_358,&local_368);
        if (!bVar2) break;
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_358);
        t_field::set_req(*pptVar8,T_OPTIONAL);
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_358);
        t_struct::append((t_struct *)local_1e8,*pptVar8);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_358);
      }
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x15])(this,local_1e8);
      t_field::~t_field((t_field *)local_318);
      t_struct::~t_struct((t_struct *)local_1e8);
    }
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_38);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  return;
}

Assistant:

void t_c_glib_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator function_iter;

  // Iterate through the service's methods
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string function_name = (*function_iter)->get_name();
    t_struct* arg_list = (*function_iter)->get_arglist();
    string arg_list_name_orig = arg_list->get_name();

    // Generate the arguments class
    arg_list->set_name(tservice->get_name() + underscores_to_initial_caps(function_name) + "Args");
    generate_struct(arg_list);

    arg_list->set_name(arg_list_name_orig);

    // Generate the result class
    if (!(*function_iter)->is_oneway()) {
      t_struct result(program_,
                      tservice->get_name() + underscores_to_initial_caps(function_name) + "Result");
      t_field success((*function_iter)->get_returntype(), "success", 0);
      success.set_req(t_field::T_OPTIONAL);
      if (!(*function_iter)->get_returntype()->is_void()) {
        result.append(&success);
      }

      t_struct* xs = (*function_iter)->get_xceptions();
      const vector<t_field*>& fields = xs->get_members();
      vector<t_field*>::const_iterator field_iter;
      for (field_iter = fields.begin(); field_iter != fields.end(); ++field_iter) {
        (*field_iter)->set_req(t_field::T_OPTIONAL);
        result.append(*field_iter);
      }

      generate_struct(&result);
    }
  }
}